

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
mxx::all2all<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *msgs,size_t size,
                 comm *comm)

{
  allocator_type local_21;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)comm->m_size * size,&local_21);
  all2all<int>(msgs,size,
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const T* msgs, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size*comm.size());
    all2all(msgs, size, &result[0], comm);
    return result;
}